

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall
spectest::JSONParser::ParseConstValue
          (JSONParser *this,Type type,Value *out_value,ExpectedNan *out_nan,string_view value_str,
          AllowExpected allow_expected)

{
  bool bVar1;
  Result RVar2;
  ulong uVar3;
  char *pcVar4;
  string_view y;
  string_view y_00;
  uint32_t value;
  undefined4 uStack_34;
  Type type_local;
  
  *out_nan = None;
  type_local = type;
  switch(type.enum_) {
  case ExternRef:
    y.size_ = 4;
    y.data_ = "null";
    bVar1 = wabt::operator==(value_str,y);
    if (bVar1) goto LAB_001878fc;
    RVar2 = ParseI32Value(this,&value,value_str);
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    uVar3 = (ulong)(value + 1);
    goto LAB_00187906;
  case FuncRef:
    y_00.size_ = 4;
    y_00.data_ = "null";
    bVar1 = wabt::operator==(value_str,y_00);
    if (!bVar1) {
      if (allow_expected != Yes) {
        __assert_fail("allow_expected == AllowExpected::Yes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc"
                      ,0x32c,
                      "wabt::Result spectest::JSONParser::ParseConstValue(Type, Value *, ExpectedNan *, string_view, AllowExpected)"
                     );
      }
      (out_value->field_0).i64_ = 1;
      goto LAB_00187953;
    }
LAB_001878fc:
    uVar3 = 0;
LAB_00187906:
    (out_value->field_0).i64_ = uVar3;
LAB_00187953:
    (out_value->type).enum_ = ExternRef;
    return (Result)Ok;
  default:
    pcVar4 = wabt::Type::GetName(&type_local);
    PrintError(this,"unknown concrete type: \"%s\"",pcVar4);
    break;
  case V128:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/spectest-interp.cc"
                  ,0x325,
                  "wabt::Result spectest::JSONParser::ParseConstValue(Type, Value *, ExpectedNan *, string_view, AllowExpected)"
                 );
  case F64:
    RVar2 = ParseF64Value(this,(uint64_t *)&value,out_nan,value_str,allow_expected);
    if (RVar2.enum_ != Error) {
      (out_value->field_0).i64_ = CONCAT44(uStack_34,value);
      (out_value->type).enum_ = F64;
      return (Result)Ok;
    }
    return (Result)Error;
  case F32:
    RVar2 = ParseF32Value(this,&value,out_nan,value_str,allow_expected);
    if (RVar2.enum_ != Error) {
      (out_value->field_0).i32_ = value;
      (out_value->type).enum_ = F32;
      return (Result)Ok;
    }
    break;
  case I64:
    RVar2 = ParseI64Value(this,(uint64_t *)&value,value_str);
    if (RVar2.enum_ != Error) {
      (out_value->field_0).i64_ = CONCAT44(uStack_34,value);
      (out_value->type).enum_ = I64;
      return (Result)Ok;
    }
    break;
  case I32:
    RVar2 = ParseI32Value(this,&value,value_str);
    if (RVar2.enum_ != Error) {
      (out_value->field_0).i32_ = value;
      (out_value->type).enum_ = I32;
      return (Result)Ok;
    }
  }
  return (Result)Error;
}

Assistant:

wabt::Result JSONParser::ParseConstValue(Type type,
                                         Value* out_value,
                                         ExpectedNan* out_nan,
                                         string_view value_str,
                                         AllowExpected allow_expected) {
  *out_nan = ExpectedNan::None;

  switch (type) {
    case Type::I32: {
      uint32_t value;
      CHECK_RESULT(ParseI32Value(&value, value_str));
      out_value->Set(value);
      break;
    }

    case Type::F32: {
      uint32_t value_bits;
      CHECK_RESULT(
          ParseF32Value(&value_bits, out_nan, value_str, allow_expected));
      out_value->Set(Bitcast<f32>(value_bits));
      break;
    }

    case Type::I64: {
      uint64_t value;
      CHECK_RESULT(ParseI64Value(&value, value_str));
      out_value->Set(value);
      break;
    }

    case Type::F64: {
      uint64_t value_bits;
      CHECK_RESULT(
          ParseF64Value(&value_bits, out_nan, value_str, allow_expected));
      out_value->Set(Bitcast<f64>(value_bits));
      break;
    }

    case Type::V128:
      assert(false);  // Should use ParseLaneConstValue instead.
      break;

    case Type::FuncRef:
      if (value_str == "null") {
        out_value->Set(Ref::Null);
      } else {
        assert(allow_expected == AllowExpected::Yes);
        out_value->Set(Ref{1});
      }
      break;

    case Type::ExternRef:
      if (value_str == "null") {
        out_value->Set(Ref::Null);
      } else {
        uint32_t value;
        CHECK_RESULT(ParseI32Value(&value, value_str));
        // TODO: hack, just whatever ref is at this index; but skip null (which
        // is always 0).
        out_value->Set(Ref{value + 1});
      }
      break;

    default:
      PrintError("unknown concrete type: \"%s\"", type.GetName());
      return wabt::Result::Error;
  }

  return wabt::Result::Ok;
}